

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionManager.cpp
# Opt level: O3

void __thiscall OpenMD::InteractionManager::doPreForce(InteractionManager *this,SelfData *sdat)

{
  int iVar1;
  pointer piVar2;
  element_type *peVar3;
  element_type *peVar4;
  uint uVar5;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  iVar1 = sdat->atid;
  piVar2 = (this->sHash_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = piVar2[iVar1];
  if ((uVar5 & 4) != 0) {
    peVar3 = (this->eam_).super___shared_ptr<OpenMD::EAM,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar3->super_MetallicInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction[8])
              (peVar3,sdat);
    uVar5 = piVar2[iVar1];
  }
  if ((uVar5 & 8) == 0) {
    return;
  }
  peVar4 = (this->sc_).super___shared_ptr<OpenMD::SC,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar4->super_MetallicInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction[8])
            (peVar4,sdat);
  return;
}

Assistant:

void InteractionManager::doPreForce(SelfData& sdat) {
    if (!initialized_) initialize();

    int& sHash = sHash_[sdat.atid];

    if ((sHash & EAM_INTERACTION) != 0) eam_->calcFunctional(sdat);
    if ((sHash & SC_INTERACTION) != 0) sc_->calcFunctional(sdat);

    // set<NonBondedInteraction*>::iterator it;
    //
    // for (it = interactions_[atid1][atid2].begin();
    //      it != interactions_[atid1][atid2].end(); ++it){
    //   if ((*it)->getFamily() == METALLIC_EMBEDDING_FAMILY) {
    //     dynamic_cast<MetallicInteraction*>(*it)->calcFunctional(sdat);
    //   }
    // }

    return;
  }